

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O2

void Wln_RetRetimeForward(Wln_Ret_t *p,Vec_Int_t *vSet)

{
  int iObj;
  int iFlop;
  int i;
  int i_00;
  
  for (i_00 = 0; i_00 < vSet->nSize; i_00 = i_00 + 1) {
    iObj = Vec_IntEntry(vSet,i_00);
    iFlop = Wln_RetRemoveOneFanin(p,iObj);
    if (iFlop != -1) {
      Wln_RetInsertOneFanout(p,iObj,iFlop);
    }
  }
  return;
}

Assistant:

void Wln_RetRetimeForward( Wln_Ret_t * p, Vec_Int_t * vSet )
{
    int i, iObj, iFlop;
    Vec_IntForEachEntry( vSet, iObj, i )
    {
        iFlop = Wln_RetRemoveOneFanin( p, iObj );
        if ( iFlop == -1 )
            continue;
        Wln_RetInsertOneFanout( p, iObj, iFlop );
    }
}